

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O0

void zerohyp_multi(int N,double *b,int p,double *varcovar,double *tval,double *pval)

{
  double dVar1;
  double dVar2;
  int local_40;
  int i;
  int df;
  double *pval_local;
  double *tval_local;
  double *varcovar_local;
  int p_local;
  double *b_local;
  int N_local;
  
  for (local_40 = 0; local_40 < p; local_40 = local_40 + 1) {
    dVar2 = b[local_40];
    dVar1 = sqrt(varcovar[(p + 1) * local_40]);
    tval[local_40] = ABS(dVar2) / dVar1;
    dVar2 = tcdf(ABS(tval[local_40]),N - p);
    pval[local_40] = 1.0 - dVar2;
  }
  return;
}

Assistant:

void zerohyp_multi(int N, double *b, int p, double *varcovar, double *tval, double *pval) {
	int df, i;
	/*
	* Zero Hypothesis Test for CLRM
	*/

	df = N - p;

	for (i = 0; i < p; ++i) {
		tval[i] = fabs(b[i]) / sqrt(varcovar[(p + 1)*i]);
		pval[i] = 1.0 - tcdf(fabs(tval[i]), df);
	}

}